

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

bool __thiscall
Fossilize::StateReplayer::Impl::parse_sints(Impl *this,Value *ints,int32_t **out_sints)

{
  SizeType SVar1;
  int iVar2;
  int *piVar3;
  ValueIterator this_00;
  ValueIterator pGVar4;
  int *piVar5;
  
  SVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::Size(ints);
  piVar3 = ScratchAllocator::allocate_n<int>(&this->allocator,(ulong)SVar1);
  this_00 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::Begin(ints);
  piVar5 = piVar3;
  while( true ) {
    pGVar4 = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::End(ints);
    if (this_00 == pGVar4) break;
    iVar2 = rapidjson::
            GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
            ::GetInt(this_00);
    *piVar5 = iVar2;
    this_00 = this_00 + 1;
    piVar5 = piVar5 + 1;
  }
  *out_sints = piVar3;
  return true;
}

Assistant:

bool StateReplayer::Impl::parse_sints(const Value &ints, const int32_t **out_sints)
{
	auto *s32s = allocator.allocate_n<int32_t>(ints.Size());
	auto *ret = s32s;
	for (auto itr = ints.Begin(); itr != ints.End(); ++itr, s32s++)
		*s32s = itr->GetInt();

	*out_sints = ret;
	return true;
}